

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

int mdns_string_equal(void *buffer_lhs,size_t size_lhs,size_t *ofs_lhs,void *buffer_rhs,
                     size_t size_rhs,size_t *ofs_rhs)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t offset;
  mdns_string_pair_t local_80;
  size_t *local_68;
  size_t *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  sVar8 = *ofs_lhs;
  offset = *ofs_rhs;
  local_38 = 0xffffffffffffffff;
  local_40 = 0xffffffffffffffff;
  local_68 = ofs_lhs;
  local_60 = ofs_rhs;
  local_58 = size_lhs;
  local_50 = size_rhs;
  while( true ) {
    mdns_get_next_substring(&local_80,buffer_lhs,local_58,sVar8);
    iVar5 = local_80.ref;
    sVar3 = local_80.length;
    sVar1 = local_80.offset;
    mdns_get_next_substring(&local_80,buffer_rhs,local_50,offset);
    iVar6 = local_80.ref;
    sVar4 = local_80.length;
    sVar2 = local_80.offset;
    if (sVar1 == 0xffffffffffffffff) {
      return 0;
    }
    if (local_80.offset == 0xffffffffffffffff) {
      return 0;
    }
    if (sVar3 != local_80.length) {
      return 0;
    }
    local_48 = sVar3;
    iVar7 = strncasecmp((char *)((long)buffer_rhs + local_80.offset),
                        (char *)((long)buffer_lhs + sVar1),local_80.length);
    if (iVar7 != 0) break;
    sVar8 = sVar8 + 2;
    if (local_40 != 0xffffffffffffffff) {
      sVar8 = local_40;
    }
    if (iVar5 != 0) {
      local_40 = sVar8;
    }
    sVar8 = offset + 2;
    if (local_38 != 0xffffffffffffffff) {
      sVar8 = local_38;
    }
    if (iVar6 != 0) {
      local_38 = sVar8;
    }
    sVar8 = sVar1 + local_48;
    offset = sVar4 + sVar2;
    if (local_48 == 0) {
      sVar8 = sVar8 + 1;
      if (local_40 != 0xffffffffffffffff) {
        sVar8 = local_40;
      }
      *local_68 = sVar8;
      sVar8 = offset + 1;
      if (local_38 != 0xffffffffffffffff) {
        sVar8 = local_38;
      }
      *local_60 = sVar8;
      return 1;
    }
  }
  return 0;
}

Assistant:

int
mdns_string_equal(const void* buffer_lhs, size_t size_lhs, size_t* ofs_lhs,
                  const void* buffer_rhs, size_t size_rhs, size_t* ofs_rhs) {
	size_t lhs_cur = *ofs_lhs;
	size_t rhs_cur = *ofs_rhs;
	size_t lhs_end = MDNS_INVALID_POS;
	size_t rhs_end = MDNS_INVALID_POS;
	mdns_string_pair_t lhs_substr;
	mdns_string_pair_t rhs_substr;
	do {
		lhs_substr = mdns_get_next_substring(buffer_lhs, size_lhs, lhs_cur);
		rhs_substr = mdns_get_next_substring(buffer_rhs, size_rhs, rhs_cur);
		if ((lhs_substr.offset == MDNS_INVALID_POS) || (rhs_substr.offset == MDNS_INVALID_POS))
			return 0;
		if (lhs_substr.length != rhs_substr.length)
			return 0;
		if (strncasecmp((const char*)buffer_rhs + rhs_substr.offset,
		                (const char*)buffer_lhs + lhs_substr.offset, rhs_substr.length))
			return 0;
		if (lhs_substr.ref && (lhs_end == MDNS_INVALID_POS))
			lhs_end = lhs_cur + 2;
		if (rhs_substr.ref && (rhs_end == MDNS_INVALID_POS))
			rhs_end = rhs_cur + 2;
		lhs_cur = lhs_substr.offset + lhs_substr.length;
		rhs_cur = rhs_substr.offset + rhs_substr.length;
	}
	while (lhs_substr.length);

	if (lhs_end == MDNS_INVALID_POS)
		lhs_end = lhs_cur + 1;
	*ofs_lhs = lhs_end;

	if (rhs_end == MDNS_INVALID_POS)
		rhs_end = rhs_cur + 1;
	*ofs_rhs = rhs_end;

	return 1;
}